

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cpp
# Opt level: O1

IrSim * __thiscall IrSim::commitIc(IrSim *this,C_IC *ic)

{
  pointer pIVar1;
  size_t __n;
  pointer pIVar2;
  int iVar3;
  mapped_type_conflict *pmVar4;
  InterCode local_c0;
  
  iVar3 = ic->kind;
  if (iVar3 == 0) {
    return this;
  }
  if ((ic->target).kind != 0) {
    if (iVar3 == 0x10) {
      pIVar1 = (this->irList).super__Vector_base<InterCode,_std::allocator<InterCode>_>._M_impl.
               super__Vector_impl_data._M_finish;
      pIVar2 = (this->irList).super__Vector_base<InterCode,_std::allocator<InterCode>_>._M_impl.
               super__Vector_impl_data._M_start;
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::operator[](&this->labels,&(ic->target).value);
      *pmVar4 = (int)((ulong)((long)pIVar1 - (long)pIVar2) >> 3) * 0x286bca1b;
    }
    else if ((((iVar3 == 9) &&
              (pIVar1 = (this->irList).super__Vector_base<InterCode,_std::allocator<InterCode>_>.
                        _M_impl.super__Vector_impl_data._M_finish,
              pIVar1 != (this->irList).super__Vector_base<InterCode,_std::allocator<InterCode>_>.
                        _M_impl.super__Vector_impl_data._M_start)) && (pIVar1[-1].kind == 6)) &&
            ((__n = pIVar1[-1].target.value._M_string_length,
             __n == (ic->target).value._M_string_length &&
             ((__n == 0 ||
              (iVar3 = bcmp(pIVar1[-1].target.value._M_dataplus._M_p,
                            (ic->target).value._M_dataplus._M_p,__n), iVar3 == 0)))))) {
      icNoOp(&local_c0,this,10,&pIVar1[-1].arg1);
      InterCode::operator=(pIVar1 + -1,&local_c0);
      InterCode::~InterCode(&local_c0);
      return this;
    }
    std::vector<InterCode,_std::allocator<InterCode>_>::push_back(&this->irList,ic);
    return this;
  }
  return this;
}

Assistant:

IrSim &IrSim::commitIc(C_IC &ic) {
    if (!ic.kind || !ic[0].kind)
        return *this;
    if (ic.kind == IC_ARG) {
        auto it = irList.rbegin();
        if (it != irList.rend() && it->kind == IC_REF && it->target.value == ic.target.value) {
            *it = icArgAddr(it->arg1);
            return *this;
        }
    }
    else if (ic.kind == IC_LABEL) {
        labels[ic.target.value] = (int)irList.size();
    }
    irList.push_back(ic);
    return *this;
}